

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O3

lword entry_address(GlobalVars *gv)

{
  node *pnVar1;
  int iVar2;
  Symbol *pSVar3;
  ushort **ppuVar4;
  node *pnVar5;
  lword entry;
  node *local_10;
  
  if (gv->entry_name != (char *)0x0) {
    local_10 = (node *)0x0;
    pSVar3 = findsymbol(gv,(Section *)0x0,gv->entry_name);
    if (pSVar3 != (Symbol *)0x0) goto LAB_001113f7;
    ppuVar4 = __ctype_b_loc();
    if (((*(byte *)((long)*ppuVar4 + (ulong)(byte)*gv->entry_name * 2 + 1) & 8) != 0) &&
       (iVar2 = __isoc99_sscanf(gv->entry_name,"%lli",&local_10), iVar2 == 1)) {
      return (lword)local_10;
    }
  }
  pSVar3 = findsymbol(gv,(Section *)0x0,"_start");
  if (pSVar3 == (Symbol *)0x0) {
    pnVar1 = (gv->lnksec).first;
    do {
      pnVar5 = pnVar1;
      pnVar1 = pnVar5->next;
      if (pnVar1 == (node *)0x0) {
        return 0;
      }
    } while ((((~*(byte *)((long)&pnVar5[2].next + 2) & 5) != 0) ||
             (((ulong)pnVar5[2].next & 0x300) != 0x100)) || (*(char *)&pnVar5[2].next != '\x01'));
    return (lword)pnVar5[4].pred;
  }
LAB_001113f7:
  return pSVar3->value;
}

Assistant:

lword entry_address(struct GlobalVars *gv)
/* returns address of entry point for executables */
{
  struct Symbol *sym;
  struct LinkedSection *ls;

  if (gv->entry_name) {
    lword entry = 0;

    if (sym = findsymbol(gv,NULL,gv->entry_name)) {
      return (lword)sym->value;
    }
    else if (isdigit((unsigned char)*gv->entry_name)) {
      if (sscanf(gv->entry_name,"%lli",&entry) == 1)
        return entry;
    }
  }

  /* plan b: search for _start symbol: */
  if (sym = findsymbol(gv,NULL,"_start"))
      return (lword)sym->value;

  /* plan c: search for first executable section */
  if (ls = find_lnksec(gv,NULL,ST_CODE,SF_ALLOC,SF_ALLOC|SF_UNINITIALIZED,
                       SP_READ|SP_EXEC))
    return (lword)ls->base;

  return 0;
}